

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O1

bool __thiscall
wallet::WalletBatch::
WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
          (WalletBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
          *key,pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *value,
          bool fOverwrite)

{
  __int_type_conflict4 _Var1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = DatabaseBatch::
          Write<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,key,value,
                     fOverwrite);
  if (bVar3) {
    (*this->m_database->_vptr_WalletDatabase[10])();
    _Var1 = (this->m_database->nUpdateCounter).super___atomic_base<unsigned_int>._M_i;
    if ((_Var1 * 0x26e978d5 >> 3 | _Var1 * -0x60000000) < 0x418938) {
      (*((this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)->_vptr_DatabaseBatch
        [6])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteIC(const K& key, const T& value, bool fOverwrite = true)
    {
        if (!m_batch->Write(key, value, fOverwrite)) {
            return false;
        }
        m_database.IncrementUpdateCounter();
        if (m_database.nUpdateCounter % 1000 == 0) {
            m_batch->Flush();
        }
        return true;
    }